

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O3

void gen_mffsce(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  uintptr_t o_1;
  TCGTemp *a1;
  TCGv_i32 pTVar1;
  uintptr_t o;
  TCGv_i64 ret;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  if ((ctx->insns_flags2 & 0x80000) != 0) {
    if (ctx->fpu_enabled == false) {
      gen_exception(ctx,7);
      return;
    }
    s = ctx->uc->tcg_ctx;
    a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)a1 - (long)s);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    tcg_gen_callN_ppc64(s,helper_reset_fpstatus,(TCGTemp *)0x0,1,&local_48);
    if (cpu_fpscr != ret) {
      tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)a1,(TCGArg)(cpu_fpscr + (long)s));
    }
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12b28);
    tcg_gen_andi_i64_ppc64(s,ret,ret,-0xf9);
    pTVar1 = tcg_const_i32_ppc64(s,3);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    local_40 = (TCGTemp *)(ret + (long)s);
    local_38 = (TCGTemp *)(pTVar1 + (long)s);
    tcg_gen_callN_ppc64(s,helper_store_fpscr,(TCGTemp *)0x0,3,&local_48);
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(pTVar1 + (long)s));
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
  }
  return;
}

Assistant:

static void gen_mffsce(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0;
    TCGv_i32 mask;

    if (unlikely(!(ctx->insns_flags2 & PPC2_ISA300))) {
        return;
    }

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }

    t0 = tcg_temp_new_i64(tcg_ctx);

    gen_reset_fpstatus(tcg_ctx);
    tcg_gen_extu_tl_i64(tcg_ctx, t0, cpu_fpscr);
    set_fpr(tcg_ctx, rD(ctx->opcode), t0);

    /* Clear exception enable bits in the FPSCR.  */
    tcg_gen_andi_i64(tcg_ctx, t0, t0, ~FP_ENABLES);
    mask = tcg_const_i32(tcg_ctx, 0x0003);
    gen_helper_store_fpscr(tcg_ctx, tcg_ctx->cpu_env, t0, mask);

    tcg_temp_free_i32(tcg_ctx, mask);
    tcg_temp_free_i64(tcg_ctx, t0);
}